

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O0

void o_xtra_act(keypress ch,wchar_t oid)

{
  _Bool _Var1;
  int16_t kind;
  object_kind *kind_00;
  char *pcVar2;
  char local_88 [8];
  char text [80];
  object_kind *k;
  wchar_t oid_local;
  keycode_t kStack_10;
  keypress ch_local;
  
  kind_00 = objkind_byid(oid);
  if (kind_00 != (object_kind *)0x0) {
    _Var1 = ignore_tval(kind_00->tval);
    kStack_10 = ch.code;
    if ((_Var1) && ((kStack_10 == 0x73 || (kStack_10 == 0x53)))) {
      if ((kind_00->aware & 1U) == 0) {
        _Var1 = kind_is_ignored_unaware(kind_00);
        if (_Var1) {
          kind_ignore_clear(kind_00);
        }
        else {
          kind_ignore_when_unaware(kind_00);
        }
      }
      else {
        _Var1 = kind_is_ignored_aware(kind_00);
        if (_Var1) {
          kind_ignore_clear(kind_00);
        }
        else {
          kind_ignore_when_aware(kind_00);
        }
      }
    }
    else {
      kind = (int16_t)oid;
      if (kStack_10 == 0x7d) {
        remove_autoinscription(kind);
      }
      else if (kStack_10 == 0x7b) {
        memset(local_88,0,0x50);
        screen_save();
        prt("Inscribe with: ",L'\0',L'\0');
        if ((kind_00->note_aware != 0) || (kind_00->note_unaware != 0)) {
          pcVar2 = get_autoinscription(kind_00,(_Bool)(kind_00->aware & 1));
          strnfmt(local_88,0x50,"%s",pcVar2);
        }
        _Var1 = askfor_aux(local_88,0x50,
                           (_func__Bool_char_ptr_size_t_size_t_ptr_size_t_ptr_keypress__Bool *)0x0);
        if (_Var1) {
          if ((kind_00->note_aware != 0) || (kind_00->note_unaware != 0)) {
            remove_autoinscription(kind);
          }
          add_autoinscription(kind,local_88,(_Bool)(kind_00->aware & 1));
          cmdq_push(CMD_AUTOINSCRIBE);
          player->upkeep->redraw = player->upkeep->redraw | 0x60000;
        }
        screen_load();
      }
    }
  }
  return;
}

Assistant:

static void o_xtra_act(struct keypress ch, int oid)
{
	struct object_kind *k = objkind_byid(oid);
	if (!k) return;

	/* Toggle ignore */
	if (ignore_tval(k->tval) && (ch.code == 's' || ch.code == 'S')) {
		if (k->aware) {
			if (kind_is_ignored_aware(k))
				kind_ignore_clear(k);
			else
				kind_ignore_when_aware(k);
		} else {
			if (kind_is_ignored_unaware(k))
				kind_ignore_clear(k);
			else
				kind_ignore_when_unaware(k);
		}

		return;
	}

	/* Uninscribe */
	if (ch.code == '}') {
		remove_autoinscription(oid);
	} else if (ch.code == '{') {
		/* Inscribe */
		char text[80] = "";

		/* Avoid the prompt getting in the way */
		screen_save();

		/* Prompt */
		prt("Inscribe with: ", 0, 0);

		/* Default note */
		if (k->note_aware || k->note_unaware)
			strnfmt(text, sizeof(text), "%s", get_autoinscription(k, k->aware));

		/* Get an inscription */
		if (askfor_aux(text, sizeof(text), NULL)) {
			/* Remove old inscription if existent */
			if (k->note_aware || k->note_unaware)
				remove_autoinscription(oid);

			/* Add the autoinscription */
			add_autoinscription(oid, text, k->aware);
			cmdq_push(CMD_AUTOINSCRIBE);

			/* Redraw gear */
			player->upkeep->redraw |= (PR_INVEN | PR_EQUIP);
		}

		/* Reload the screen */
		screen_load();
	}
}